

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_ProFileCache::Entry>_>::begin
          (Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *this)

{
  long lVar1;
  iterator iVar2;
  bool bVar3;
  ulong in_RDI;
  long in_FS_OFFSET;
  iterator it;
  iterator<QHashPrivate::Node<int,_ProFileCache::Entry>_> *in_stack_ffffffffffffffc8;
  iterator<QHashPrivate::Node<int,_ProFileCache::Entry>_> *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = iterator<QHashPrivate::Node<int,_ProFileCache::Entry>_>::isUnused
                    (in_stack_ffffffffffffffd0);
  if (bVar3) {
    iterator<QHashPrivate::Node<int,_ProFileCache::Entry>_>::operator++(in_stack_ffffffffffffffc8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  iVar2.bucket = 0;
  iVar2.d = (Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *)in_RDI;
  return iVar2;
}

Assistant:

iterator begin() const noexcept
    {
        iterator it{ this, 0 };
        if (it.isUnused())
            ++it;
        return it;
    }